

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bgetsa(bstring b,bNgetc getcPtr,void *parm,char terminator)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  uVar3 = 0xffffffff;
  if (((b != (bstring)0x0) && (uVar1 = b->mlen, uVar3 = 0xffffffff, 0 < (int)uVar1)) &&
     (uVar6 = (ulong)(uint)b->slen, getcPtr != (bNgetc)0x0 && (uint)b->slen <= uVar1)) {
    iVar4 = uVar1 - 2;
    do {
      iVar2 = (*getcPtr)(parm);
      if (iVar2 < 0) break;
      iVar5 = (int)uVar6;
      if (iVar4 < iVar5) {
        b->slen = iVar5;
        iVar4 = balloc(b,iVar5 + 2);
        if (iVar4 != 0) {
          return -1;
        }
        iVar4 = b->mlen + -2;
      }
      b->data[uVar6] = (uchar)iVar2;
      uVar6 = uVar6 + 1;
    } while (iVar2 != terminator);
    b->data[uVar6 & 0xffffffff] = '\0';
    b->slen = (int)uVar6;
    uVar3 = (uint)(iVar2 < 0 && (int)uVar6 == 0);
  }
  return uVar3;
}

Assistant:

int bgetsa (bstring b, bNgetc getcPtr, void * parm, char terminator) {
int c, d, e;

	if (b == NULL || b->mlen <= 0 || b->slen < 0 || b->mlen < b->slen ||
	    b->mlen <= 0 || getcPtr == NULL) return BSTR_ERR;
	d = b->slen;
	e = b->mlen - 2;

	while ((c = getcPtr (parm)) >= 0) {
		if (d > e) {
			b->slen = d;
			if (balloc (b, d + 2) != BSTR_OK) return BSTR_ERR;
			e = b->mlen - 2;
		}
		b->data[d] = (unsigned char) c;
		d++;
		if (c == terminator) break;
	}

	b->data[d] = (unsigned char) '\0';
	b->slen = d;

	return d == 0 && c < 0;
}